

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O3

ssize_t __thiscall
blcl::net::connection<MsgType>::send
          (connection<MsgType> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  io_context *piVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  type local_40;
  io_context *local_18;
  undefined4 local_c;
  
  piVar1 = this->asio_context_;
  local_40.msg.header = *(message_header<MsgType> *)CONCAT44(in_register_00000034,__fd);
  local_40.this = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_40.msg.body,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((message_header<MsgType> *)CONCAT44(in_register_00000034,__fd) + 1));
  local_c = 1;
  local_18 = piVar1;
  asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<blcl::net::connection<MsgType>::send(blcl::net::message<MsgType>const&)::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_18,&local_40);
  sVar2 = extraout_RAX;
  if (local_40.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.msg.body.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.msg.body.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.msg.body.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    sVar2 = extraout_RAX_00;
  }
  return sVar2;
}

Assistant:

void send(const message<T>& msg) {
            asio::post(asio_context_,
                [this, msg]() {
                    bool writing_message = !outgoing_messages_.empty();
                    outgoing_messages_.push_back(msg);
                    if (!writing_message)
                        write_header();
            });
        }